

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncToString(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
               vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  ExpressionValueType EVar1;
  const_reference pvVar2;
  string local_b8;
  StringLiteral local_98;
  string local_78;
  StringLiteral local_58;
  undefined1 local_21;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *local_20;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  ExpressionValue *result;
  
  local_21 = 0;
  local_20 = parameters;
  parameters_local = (vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)funcName;
  funcName_local = (Identifier *)__return_storage_ptr__;
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  pvVar2 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](local_20,0);
  EVar1 = pvVar2->type;
  if (EVar1 == Integer) {
    pvVar2 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](local_20,0);
    tinyformat::format<long>(&local_78,"%d",&(pvVar2->field_1).intValue);
    StringLiteral::StringLiteral(&local_58,&local_78);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&local_58);
    StringLiteral::~StringLiteral(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else if (EVar1 == Float) {
    pvVar2 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](local_20,0);
    tinyformat::format<double>(&local_b8,"%#.17g",&(pvVar2->field_1).floatValue);
    StringLiteral::StringLiteral(&local_98,&local_b8);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&local_98);
    StringLiteral::~StringLiteral(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    if (EVar1 != String) {
      return __return_storage_ptr__;
    }
    pvVar2 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](local_20,0);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&pvVar2->strValue);
  }
  __return_storage_ptr__->type = String;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncToString(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;

	switch (parameters[0].type)
	{
	case ExpressionValueType::String:
		result.strValue = parameters[0].strValue;
		break;
	case ExpressionValueType::Integer:
		result.strValue = tfm::format("%d",parameters[0].intValue);
		break;
	case ExpressionValueType::Float:
		result.strValue = tfm::format("%#.17g",parameters[0].floatValue);
		break;
	default:
		return result;
	}

	result.type = ExpressionValueType::String;
	return result;
}